

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar1 = state->size;
  uVar2 = state->position;
  uVar3 = 0xffffffff;
  if (uVar2 < uVar1) {
    uVar3 = (uint)state->text[uVar2];
  }
  if ((uVar3 == 0x5f) || ((uVar3 & 0xffffffdf) - 0x41 < 0x1a)) {
    do {
      uVar4 = uVar2;
      uVar3 = 0xffffffff;
      if (uVar4 < uVar1) {
        uVar3 = (uint)state->text[uVar4];
      }
      uVar2 = uVar4 + 1;
    } while ((uVar3 - 0x30 < 10 || uVar3 == 0x5f) || (uVar3 & 0xffffffdf) - 0x41 < 0x1a);
    if ((uVar4 < uVar1) && (state->text[uVar4] == ':')) {
      state->position = uVar4 + 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)
{
    if(!sysbvm_scanner_isIdentifierStart(sysbvm_scanner_lookAt(state, 0)))
        return false;

    sysbvm_scannerState_t endState = *state;
    while(sysbvm_scanner_isIdentifierMiddle(sysbvm_scanner_lookAt(&endState, 0)))
        ++endState.position;

    if(sysbvm_scanner_lookAt(&endState, 0) == ':')
    {
        ++endState.position;
        *state = endState;
        return true;
    }

    return false;
}